

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpASIOListener.cpp
# Opt level: O0

void __thiscall mognetwork::TcpASIOListener::start(TcpASIOListener *this)

{
  list<int,_std::allocator<int>_> *plVar1;
  Selector *in_RDI;
  SocketFD fd;
  
  plVar1 = &in_RDI->m_writeSockets;
  Socket::getSocketFD((Socket *)
                      in_RDI[1].m_readUpdated.super__List_base<int,_std::allocator<int>_>._M_impl.
                      _M_node.super__List_node_base._M_prev);
  fd = (SocketFD)((ulong)plVar1 >> 0x20);
  Selector::addFdToRead(in_RDI,fd);
  Selector::addFdToRead(in_RDI,fd);
  (*(code *)(in_RDI[1].m_writeSockets.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
             super__List_node_base._M_next)->_M_next[1]._M_next)();
  return;
}

Assistant:

void TcpASIOListener::start()
  {
    m_selector.addFdToRead(m_serverSocket.getSocketFD());
#ifndef OS_WINDOWS
	//TODO Find a solution for windows
	m_selector.addFdToRead(m_pipefd[0]);
#endif // !OS_WINDOWS
    m_thread->start();
  }